

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O0

NumericExpr __thiscall
mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_ExprCounter>::
ReadNumericExpr(NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_ExprCounter>
                *this,int opcode)

{
  Reference RVar1;
  int in_ESI;
  undefined8 *in_RDI;
  SymbolicArgHandler args_4;
  int num_args_3;
  NumberOfArgHandler args_3;
  int num_args_2;
  NumericArgHandler args_2;
  int num_args_1;
  VarArgHandler args_1;
  int num_args;
  int i;
  PLTermHandler pl_handler;
  int num_slopes;
  NumericExpr else_expr;
  NumericExpr then_expr;
  LogicalExpr condition;
  BinaryArgReader<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_ExprCounter>::NumericExprReader>
  args;
  Kind kind;
  OpCodeInfo *info;
  double in_stack_ffffffffffffff28;
  bool ignore_zero;
  undefined1 ignore_zero_00;
  NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_ExprCounter>
  *in_stack_ffffffffffffff30;
  NumericExpr in_stack_ffffffffffffff38;
  Kind in_stack_ffffffffffffff3c;
  int iVar2;
  NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_ExprCounter>
  *in_stack_ffffffffffffff40;
  NumericExpr else_expr_00;
  ArgHandler *arg_handler;
  NumericExpr in_stack_ffffffffffffff48;
  LogicalExpr in_stack_ffffffffffffff4c;
  NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_ExprCounter>
  *in_stack_ffffffffffffff50;
  NLHandler<mp::NullNLHandler<Expr>,_Expr> *pNVar3;
  NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_ExprCounter>
  *in_stack_ffffffffffffff58;
  BinaryReaderBase *this_00;
  CStringRef in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  BasicCStringRef<char> local_80 [2];
  int local_70;
  int local_68;
  int local_60;
  int local_58;
  int local_50;
  BasicCStringRef<char> local_48;
  int local_3c;
  NumericExpr local_38;
  NumericExpr local_34;
  LogicalExpr local_30;
  Expr local_2c;
  Expr local_28;
  Kind local_24;
  OpCodeInfo *local_20;
  NumericExpr local_4;
  
  local_20 = GetOpCodeInfo(in_ESI);
  local_24 = local_20->kind;
  switch(local_20->first_kind) {
  case FIRST_UNARY:
    ReadNumericExpr(in_stack_ffffffffffffff30,SUB81((ulong)in_stack_ffffffffffffff28 >> 0x38,0));
    local_4 = NLHandler<mp::NullNLHandler<Expr>,_Expr>::OnUnary
                        ((NLHandler<mp::NullNLHandler<Expr>,_Expr> *)in_stack_ffffffffffffff40,
                         in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38);
    break;
  default:
    fmt::BasicCStringRef<char>::BasicCStringRef(local_80,"expected numeric expression opcode");
    BinaryReaderBase::ReportError<>
              ((BinaryReaderBase *)in_stack_ffffffffffffff58,in_stack_ffffffffffffff60);
    local_4 = OTHER;
    break;
  case ADD:
    BinaryArgReader<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_ExprCounter>::NumericExprReader>
    ::BinaryArgReader((BinaryArgReader<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_ExprCounter>::NumericExprReader>
                       *)in_stack_ffffffffffffff40,
                      (NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_ExprCounter>
                       *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
    local_4 = ExprCounter::OnBinary((ExprCounter *)in_RDI[2],local_24,local_2c,local_28);
    break;
  case IF:
    local_30 = ReadLogicalExpr(in_stack_ffffffffffffff58);
    else_expr_00 = (NumericExpr)((ulong)in_stack_ffffffffffffff40 >> 0x20);
    ignore_zero = SUB81((ulong)in_stack_ffffffffffffff28 >> 0x38,0);
    local_34 = ReadNumericExpr(in_stack_ffffffffffffff30,ignore_zero);
    local_38 = ReadNumericExpr(in_stack_ffffffffffffff30,ignore_zero);
    local_4 = NLHandler<mp::NullNLHandler<Expr>,_Expr>::OnIf
                        ((NLHandler<mp::NullNLHandler<Expr>,_Expr> *)in_stack_ffffffffffffff50,
                         in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48,else_expr_00);
    break;
  case PLTERM:
    local_3c = BinaryReader<mp::internal::IdentityConverter>::ReadUInt
                         ((BinaryReader<mp::internal::IdentityConverter> *)in_stack_ffffffffffffff40
                         );
    if (local_3c < 2) {
      this_00 = (BinaryReaderBase *)*in_RDI;
      fmt::BasicCStringRef<char>::BasicCStringRef
                (&local_48,"too few slopes in piecewise-linear term");
      BinaryReaderBase::ReportError<>(this_00,in_stack_ffffffffffffff60);
    }
    BinaryReaderBase::ReadTillEndOfLine((BinaryReaderBase *)*in_RDI);
    NLHandler<mp::NullNLHandler<Expr>,_Expr>::BeginPLTerm
              ((NLHandler<mp::NullNLHandler<Expr>,_Expr> *)in_stack_ffffffffffffff30,
               (int)((ulong)in_stack_ffffffffffffff28 >> 0x20));
    for (local_50 = 0; local_50 < local_3c + -1; local_50 = local_50 + 1) {
      ReadConstant(in_stack_ffffffffffffff30);
      NLHandler<mp::NullNLHandler<Expr>,_Expr>::PLTermHandler::AddSlope
                ((PLTermHandler *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
      ReadConstant(in_stack_ffffffffffffff30);
      NLHandler<mp::NullNLHandler<Expr>,_Expr>::PLTermHandler::AddBreakpoint
                ((PLTermHandler *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    }
    ReadConstant(in_stack_ffffffffffffff30);
    NLHandler<mp::NullNLHandler<Expr>,_Expr>::PLTermHandler::AddSlope
              ((PLTermHandler *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    pNVar3 = (NLHandler<mp::NullNLHandler<Expr>,_Expr> *)in_RDI[2];
    RVar1 = ReadReference(in_stack_ffffffffffffff40);
    local_4 = NLHandler<mp::NullNLHandler<Expr>,_Expr>::EndPLTerm(pNVar3,RVar1);
    break;
  case FIRST_ITERATED:
    local_58 = ReadNumArgs(in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c);
    NLHandler<mp::NullNLHandler<Expr>,_Expr>::BeginVarArg
              ((NLHandler<mp::NullNLHandler<Expr>,_Expr> *)in_stack_ffffffffffffff30,
               (Kind)((ulong)in_stack_ffffffffffffff28 >> 0x20),SUB84(in_stack_ffffffffffffff28,0));
    NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,ExprCounter>::
    ReadArgs<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,ExprCounter>::NumericExprReader,mp::NLHandler<mp::NullNLHandler<Expr>,Expr>::ArgHandler>
              (in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c,
               (ArgHandler *)in_stack_ffffffffffffff30);
    local_4 = NLHandler<mp::NullNLHandler<Expr>,_Expr>::EndVarArg
                        ((NLHandler<mp::NullNLHandler<Expr>,_Expr> *)in_RDI[2]);
    break;
  case SUM:
    local_60 = ReadNumArgs(in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c);
    NLHandler<mp::NullNLHandler<Expr>,_Expr>::BeginSum
              ((NLHandler<mp::NullNLHandler<Expr>,_Expr> *)in_stack_ffffffffffffff30,
               (int)((ulong)in_stack_ffffffffffffff28 >> 0x20));
    NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,ExprCounter>::
    ReadArgs<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,ExprCounter>::NumericExprReader,mp::NLHandler<mp::NullNLHandler<Expr>,Expr>::ArgHandler>
              (in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c,
               (ArgHandler *)in_stack_ffffffffffffff30);
    local_4 = NLHandler<mp::NullNLHandler<Expr>,_Expr>::EndSum
                        ((NLHandler<mp::NullNLHandler<Expr>,_Expr> *)in_RDI[2]);
    break;
  case LAST_ITERATED:
    local_68 = ReadNumArgs(in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c);
    ignore_zero_00 = (undefined1)((ulong)in_stack_ffffffffffffff28 >> 0x38);
    BinaryReaderBase::ReadTillEndOfLine((BinaryReaderBase *)*in_RDI);
    arg_handler = (ArgHandler *)in_RDI[2];
    iVar2 = local_68;
    ReadNumericExpr(in_stack_ffffffffffffff30,(bool)ignore_zero_00);
    NLHandler<mp::NullNLHandler<Expr>,_Expr>::BeginNumberOf
              ((NLHandler<mp::NullNLHandler<Expr>,_Expr> *)arg_handler,in_stack_ffffffffffffff3c,
               in_stack_ffffffffffffff38);
    NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,ExprCounter>::
    DoReadArgs<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,ExprCounter>::NumericExprReader,mp::NLHandler<mp::NullNLHandler<Expr>,Expr>::ArgHandler>
              (in_stack_ffffffffffffff50,iVar2,arg_handler);
    local_4 = NLHandler<mp::NullNLHandler<Expr>,_Expr>::EndNumberOf
                        ((NLHandler<mp::NullNLHandler<Expr>,_Expr> *)in_RDI[2]);
    break;
  case NUMBEROF_SYM:
    local_70 = ReadNumArgs(in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c);
    BinaryReaderBase::ReadTillEndOfLine((BinaryReaderBase *)*in_RDI);
    iVar2 = local_70;
    ReadSymbolicExpr((NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_ExprCounter>
                      *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    NLHandler<mp::NullNLHandler<Expr>,_Expr>::BeginSymbolicNumberOf
              ((NLHandler<mp::NullNLHandler<Expr>,_Expr> *)in_stack_ffffffffffffff40,iVar2,
               in_stack_ffffffffffffff38);
    NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,ExprCounter>::
    DoReadArgs<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,ExprCounter>::SymbolicExprReader,mp::NLHandler<mp::NullNLHandler<Expr>,Expr>::ArgHandler>
              (in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c,
               (ArgHandler *)in_stack_ffffffffffffff40);
    local_4 = NLHandler<mp::NullNLHandler<Expr>,_Expr>::EndSymbolicNumberOf
                        ((NLHandler<mp::NullNLHandler<Expr>,_Expr> *)in_RDI[2]);
    break;
  case COUNT:
    local_4 = ReadCountExpr(in_stack_ffffffffffffff30);
  }
  return local_4;
}

Assistant:

typename Handler::NumericExpr
    NLReader<Reader, Handler>::ReadNumericExpr(int opcode) {
  const internal::OpCodeInfo &info = internal::GetOpCodeInfo(opcode);
  expr::Kind kind = info.kind;
  switch (info.first_kind) {
  case expr::FIRST_UNARY:
    return handler_.OnUnary(kind, ReadNumericExpr());
  case expr::FIRST_BINARY: {
    BinaryArgReader<> args(*this);
    return handler_.OnBinary(kind, args.lhs, args.rhs);
  }
  case expr::IF: {
    LogicalExpr condition = ReadLogicalExpr();
    NumericExpr then_expr = ReadNumericExpr();
    NumericExpr else_expr = ReadNumericExpr();
    return handler_.OnIf(condition, then_expr, else_expr);
  }
  case expr::PLTERM: {
    // Read a piecewise-linear term.
    int num_slopes = reader_.ReadUInt();
    if (num_slopes <= 1)
      reader_.ReportError("too few slopes in piecewise-linear term");
    reader_.ReadTillEndOfLine();
    typename Handler::PLTermHandler pl_handler =
        handler_.BeginPLTerm(num_slopes - 1);
    for (int i = 0; i < num_slopes - 1; ++i) {
      pl_handler.AddSlope(ReadConstant());
      pl_handler.AddBreakpoint(ReadConstant());
    }
    pl_handler.AddSlope(ReadConstant());
    return handler_.EndPLTerm(pl_handler, ReadReference());
  }
  case expr::FIRST_VARARG: {
    // Read a vararg expression (min or max).
    int num_args = ReadNumArgs(1);
    typename Handler::VarArgHandler args = handler_.BeginVarArg(kind, num_args);
    ReadArgs<NumericExprReader>(num_args, args);
    return handler_.EndVarArg(args);
  }
  case expr::SUM: {
    int num_args = ReadNumArgs();
    typename Handler::NumericArgHandler args = handler_.BeginSum(num_args);
    ReadArgs<NumericExprReader>(num_args, args);
    return handler_.EndSum(args);
  }
  case expr::COUNT:
    return ReadCountExpr();
  case expr::NUMBEROF: {
    // Read a numberof expression.
    int num_args = ReadNumArgs(1);
    reader_.ReadTillEndOfLine();
    typename Handler::NumberOfArgHandler args =
        handler_.BeginNumberOf(num_args, ReadNumericExpr());
    DoReadArgs<NumericExprReader>(num_args - 1, args);
    return handler_.EndNumberOf(args);
  }
  case expr::NUMBEROF_SYM: {
    // Read a symbolic numberof expression.
    int num_args = ReadNumArgs(1);
    reader_.ReadTillEndOfLine();
    typename Handler::SymbolicArgHandler args =
        handler_.BeginSymbolicNumberOf(num_args, ReadSymbolicExpr());
    DoReadArgs<SymbolicExprReader>(num_args - 1, args);
    return handler_.EndSymbolicNumberOf(args);
  }
  default:
    reader_.ReportError("expected numeric expression opcode");
  }
  return NumericExpr();
}